

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

void __thiscall
tinyusdz::usdc::USDCReader::set_reader_config(USDCReader *this,USDCReaderConfig *config)

{
  USDCReaderConfig *pUVar1;
  Impl *pIVar2;
  size_t sVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  
  pIVar2 = this->impl_;
  pUVar1 = &pIVar2->_config;
  uVar4 = config->kMaxPrimNestLevel;
  uVar5 = config->kMaxFieldValuePairs;
  uVar6 = config->kMaxTokenLength;
  uVar7 = config->kMaxStringLength;
  uVar8 = config->kMaxElementSize;
  sVar3 = config->kMaxAllowedMemoryInMB;
  (pIVar2->_config).numThreads = config->numThreads;
  (pIVar2->_config).kMaxPrimNestLevel = uVar4;
  (pIVar2->_config).kMaxFieldValuePairs = uVar5;
  (pIVar2->_config).kMaxTokenLength = uVar6;
  *(undefined4 *)((long)&(pIVar2->_config).kMaxAllowedMemoryInMB + 7) =
       *(undefined4 *)((long)&config->kMaxAllowedMemoryInMB + 7);
  (pIVar2->_config).kMaxStringLength = uVar7;
  (pIVar2->_config).kMaxElementSize = uVar8;
  (pIVar2->_config).kMaxAllowedMemoryInMB = sVar3;
  if ((pIVar2->_config).numThreads == -1) {
    iVar9 = ::std::thread::hardware_concurrency();
    iVar10 = 1;
    if (1 < iVar9) {
      iVar10 = iVar9;
    }
    pUVar1->numThreads = iVar10;
  }
  iVar10 = 0x400;
  if (pUVar1->numThreads < 0x400) {
    iVar10 = pUVar1->numThreads;
  }
  pUVar1->numThreads = iVar10;
  return;
}

Assistant:

void USDCReader::set_reader_config(const USDCReaderConfig &config) {
  impl_->set_reader_config(config);
}